

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall xmrig::String::String(String *this,char *str,size_t size)

{
  void *pvVar1;
  long in_RDX;
  void *in_RSI;
  long *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = in_RDX;
  if (in_RSI == (void *)0x0) {
    in_RDI[1] = 0;
  }
  else {
    pvVar1 = operator_new__(in_RDI[1] + 1);
    *in_RDI = (long)pvVar1;
    memcpy((void *)*in_RDI,in_RSI,in_RDI[1]);
    *(undefined1 *)(*in_RDI + in_RDI[1]) = 0;
  }
  return;
}

Assistant:

xmrig::String::String(const char *str, size_t size) :
    m_size(size)
{
    if (str == nullptr) {
        m_size = 0;

        return;
    }

    m_data = new char[m_size + 1];
    memcpy(m_data, str, m_size);
    m_data[m_size] = '\0';
}